

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileinfo.c
# Opt level: O3

void Curl_fileinfo_dtor(void *user,void *element)

{
  if (element != (void *)0x0) {
    if (*(void **)((long)element + 0x68) != (void *)0x0) {
      (*Curl_cfree)(*(void **)((long)element + 0x68));
      *(undefined8 *)((long)element + 0x68) = 0;
    }
    (*Curl_cfree)(element);
    return;
  }
  return;
}

Assistant:

void Curl_fileinfo_dtor(void *user, void *element)
{
  struct curl_fileinfo *finfo = element;
  (void) user;
  if(!finfo)
    return;

  Curl_safefree(finfo->b_data);

  free(finfo);
}